

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

Factor * __thiscall libDAI::TRW::beliefF(TRW *this,size_t I)

{
  bool bVar1;
  long *plVar2;
  TFactor<double> *pTVar3;
  size_type sVar4;
  reference puVar5;
  VarSet *this_00;
  VarSet *ns;
  VarSet *code;
  string *msg;
  iterator a;
  reference pVVar6;
  undefined8 uVar7;
  unsigned_long in_RDX;
  long *in_RSI;
  Factor *in_RDI;
  size_t k;
  Var v_k;
  VarSet v_J;
  nb_cit J;
  Prob prod_i;
  Var v_i_1;
  nb_cit i_1;
  size_t j;
  size_t i;
  Var v_j;
  Var v_i;
  Factor prod;
  VarSet v_I;
  TFactor<double> *in_stack_fffffffffffffb88;
  FactorGraph *in_stack_fffffffffffffb90;
  Var *in_stack_fffffffffffffb98;
  TRW *in_stack_fffffffffffffba0;
  VarSet *in_stack_fffffffffffffba8;
  TRW *in_stack_fffffffffffffbb0;
  double in_stack_fffffffffffffbb8;
  allocator<char> *in_stack_fffffffffffffbc0;
  TFactor<double> *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  TFactor<double> *in_stack_fffffffffffffbd8;
  TFactor<double> *in_stack_fffffffffffffbe8;
  TFactor<double> *in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffc00;
  size_t in_stack_fffffffffffffc08;
  Exception *in_stack_fffffffffffffc10;
  VarSet *in_stack_fffffffffffffc20;
  VarSet *in_stack_fffffffffffffc28;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_200;
  long local_1f8;
  size_t sStack_1f0;
  unsigned_long *local_1c0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1b8 [4];
  Var local_198;
  unsigned_long *local_180;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_178;
  undefined1 local_16a;
  undefined8 local_110;
  undefined8 local_108;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> local_c0
  ;
  long local_b8;
  size_t sStack_b0;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> local_a0
  ;
  long local_98;
  size_t sStack_90;
  unsigned_long local_18;
  
  local_18 = in_RDX;
  plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
  pTVar3 = (TFactor<double> *)(**(code **)(*plVar2 + 0x50))(plVar2,local_18);
  TFactor<double>::vars(pTVar3);
  VarSet::VarSet((VarSet *)in_stack_fffffffffffffb90,&in_stack_fffffffffffffb88->_vs);
  TFactor<double>::TFactor((TFactor<double> *)in_stack_fffffffffffffba0);
  sVar4 = VarSet::size((VarSet *)0xba67b3);
  if (sVar4 != 1) {
    sVar4 = VarSet::size((VarSet *)0xba680f);
    if (sVar4 != 2) {
      local_16a = 1;
      uVar7 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc0);
      Exception::Exception
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      local_16a = 0;
      __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
    }
    local_a0._M_current = (Var *)VarSet::begin(&in_stack_fffffffffffffb88->_vs);
    pVVar6 = __gnu_cxx::
             __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*(&local_a0);
    local_98 = pVVar6->_label;
    sStack_90 = pVVar6->_states;
    VarSet::VarSet((VarSet *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    VarSet::operator/(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    local_c0._M_current = (Var *)VarSet::begin(&in_stack_fffffffffffffb88->_vs);
    pVVar6 = __gnu_cxx::
             __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*(&local_c0);
    local_b8 = pVVar6->_label;
    sStack_b0 = pVVar6->_states;
    VarSet::~VarSet((VarSet *)0xba68f0);
    VarSet::~VarSet((VarSet *)0xba68fd);
    plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
    local_108 = (**(code **)(*plVar2 + 0x40))(plVar2,&local_98);
    plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
    local_110 = (**(code **)(*plVar2 + 0x40))(plVar2,&local_b8);
    plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
    (**(code **)(*plVar2 + 0x50))(plVar2,local_18);
    rho(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
        (size_t)in_stack_fffffffffffffba0);
    TFactor<double>::operator^(in_stack_fffffffffffffbd8,(Real)in_stack_fffffffffffffbd0);
    TFactor<double>::operator=
              ((TFactor<double> *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb90);
  }
  (**(code **)(*in_RSI + 0x20))();
  FactorGraph::nbF(in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
  local_178._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb88
                 );
  do {
    (**(code **)(*in_RSI + 0x20))();
    FactorGraph::nbF(in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    local_180 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffb90,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffb88);
    if (!bVar1) {
      TFactor<double>::normalized
                (in_stack_fffffffffffffbc8,(NormType)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb90);
      VarSet::~VarSet((VarSet *)0xba7428);
      return in_RDI;
    }
    plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_178);
    plVar2 = (long *)(**(code **)(*plVar2 + 0x30))(plVar2,*puVar5);
    local_198._label = *plVar2;
    local_198._states = plVar2[1];
    Var::states(&local_198);
    TProb<double>::TProb
              ((TProb<double> *)in_stack_fffffffffffffbc0,(size_t)in_stack_fffffffffffffbb8);
    (**(code **)(*in_RSI + 0x20))();
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(&local_178);
    FactorGraph::nbV(in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    local_1b8[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffb88);
    while( true ) {
      this_00 = (VarSet *)(**(code **)(*in_RSI + 0x20))();
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_178);
      ns = (VarSet *)FactorGraph::nbV(in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
      local_1c0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffb88);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffb90,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffb88);
      if (!bVar1) break;
      plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_1b8);
      pTVar3 = (TFactor<double> *)(**(code **)(*plVar2 + 0x50))(plVar2,*puVar5);
      code = TFactor<double>::vars(pTVar3);
      VarSet::VarSet((VarSet *)in_stack_fffffffffffffb90,&in_stack_fffffffffffffb88->_vs);
      msg = (string *)VarSet::size((VarSet *)0xba6e4c);
      if (msg == (string *)0x1) {
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_178);
        in_stack_fffffffffffffbf0 = (TFactor<double> *)*puVar5;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_1b8);
        newMessage(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                   (size_t)in_stack_fffffffffffffb90);
        TProb<double>::operator*=
                  ((TProb<double> *)in_stack_fffffffffffffbb0,
                   (TProb<double> *)in_stack_fffffffffffffba8);
      }
      else {
        in_stack_fffffffffffffbe8 = (TFactor<double> *)VarSet::size((VarSet *)0xba6ef8);
        if (in_stack_fffffffffffffbe8 != (TFactor<double> *)0x2) {
          uVar7 = __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                     in_stack_fffffffffffffbc0);
          Exception::Exception((Exception *)pTVar3,(size_t)code,msg);
          __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
        }
        VarSet::VarSet((VarSet *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        VarSet::operator/(this_00,ns);
        a = VarSet::begin(&in_stack_fffffffffffffb88->_vs);
        local_200._M_current = a._M_current;
        pVVar6 = __gnu_cxx::
                 __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 ::operator*(&local_200);
        local_1f8 = pVVar6->_label;
        sStack_1f0 = pVVar6->_states;
        VarSet::~VarSet((VarSet *)0xba6f8c);
        VarSet::~VarSet((VarSet *)0xba6f99);
        plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
        in_stack_fffffffffffffbd0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (**(code **)(*plVar2 + 0x40))(plVar2,&local_1f8);
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(local_1b8);
        if (*puVar5 == local_18) {
          puVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_178);
          in_stack_fffffffffffffba8 = (VarSet *)*puVar5;
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_1b8);
          in_stack_fffffffffffffbb0 =
               (TRW *)newMessage(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                                 (size_t)in_stack_fffffffffffffb90);
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(&local_178);
          in_stack_fffffffffffffba0 =
               (TRW *)rho(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                          (size_t)in_stack_fffffffffffffba0);
          TProb<double>::operator^((TProb<double> *)in_stack_fffffffffffffbe8,(Real)a._M_current);
          TProb<double>::operator*=
                    ((TProb<double> *)in_stack_fffffffffffffbb0,
                     (TProb<double> *)in_stack_fffffffffffffba8);
          TProb<double>::~TProb((TProb<double> *)0xba71cb);
        }
        else {
          puVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_178);
          in_stack_fffffffffffffbc0 = (allocator<char> *)*puVar5;
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_1b8);
          in_stack_fffffffffffffbc8 =
               (TFactor<double> *)
               newMessage(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                          (size_t)in_stack_fffffffffffffb90);
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(&local_178);
          in_stack_fffffffffffffbb8 =
               rho(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                   (size_t)in_stack_fffffffffffffba0);
          TProb<double>::operator^((TProb<double> *)in_stack_fffffffffffffbe8,(Real)a._M_current);
          TProb<double>::operator*=
                    ((TProb<double> *)in_stack_fffffffffffffbb0,
                     (TProb<double> *)in_stack_fffffffffffffba8);
          TProb<double>::~TProb((TProb<double> *)0xba70a2);
        }
      }
      VarSet::~VarSet((VarSet *)0xba72e4);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
    }
    VarSet::VarSet((VarSet *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    TFactor<double>::TFactor
              ((TFactor<double> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (TProb<double> *)in_stack_fffffffffffffba0);
    TFactor<double>::operator*=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb90);
    VarSet::~VarSet((VarSet *)0xba7379);
    TProb<double>::~TProb((TProb<double> *)0xba7386);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  } while( true );
}

Assistant:

Factor TRW::beliefF (size_t I) const {
        VarSet v_I = grm().factor(I).vars();
        
        Factor prod;
        if( v_I.size() == 1 )
            ;
        else if( v_I.size() == 2 ) {
            Var v_i = *(v_I.begin());
            Var v_j = *((v_I / v_i).begin());
            size_t i = grm().findVar(v_i);
            size_t j = grm().findVar(v_j);
            prod = grm().factor(I)^(1.0 / rho(i,j));
        } else
            DAI_THROW(NOT_IMPLEMENTED);

        for( FactorGraph::nb_cit i = grm().nbF(I).begin(); i != grm().nbF(I).end(); i++ ) {
            Var v_i = grm().var( *i );
            Prob prod_i( v_i.states() );

            for( FactorGraph::nb_cit J = grm().nbV(*i).begin(); J != grm().nbV(*i).end(); J++ ) {
                VarSet v_J = grm().factor(*J).vars();
                if( v_J.size() == 1 ) {
                    prod_i *= newMessage(*i,*J);
                } else if( v_J.size() == 2 ) {
                    Var v_k = *((v_J / v_i).begin());
                    size_t k = grm().findVar(v_k);
                    if( *J != I )
                        prod_i *= newMessage(*i,*J)^rho(*i,k);
                    else
                        prod_i *= newMessage(*i,*J)^(rho(*i,k) - 1.0);
                } else
                    DAI_THROW(NOT_IMPLEMENTED);
            }

            prod *= Factor( v_i, prod_i );
        }

        return prod.normalized();
    }